

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O0

int strsm_(char *side,char *uplo,char *transa,char *diag,integer *m,integer *n,real *alpha,real *a,
          integer *lda,real *b,integer *ldb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  logical lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int local_6c;
  int local_64;
  integer i__3;
  integer i__2;
  integer i__1;
  integer b_offset;
  integer b_dim1;
  integer a_offset;
  integer a_dim1;
  integer *n_local;
  integer *m_local;
  char *diag_local;
  char *transa_local;
  char *uplo_local;
  char *side_local;
  
  iVar1 = *lda;
  iVar4 = iVar1 + 1;
  iVar2 = *ldb;
  iVar5 = iVar2 + 1;
  strsm_::lside = lsame_(side,"L");
  if (strsm_::lside == 0) {
    strsm_::nrowa = *n;
  }
  else {
    strsm_::nrowa = *m;
  }
  strsm_::nounit = lsame_(diag,"N");
  strsm_::upper = lsame_(uplo,"U");
  strsm_::info = 0;
  if ((strsm_::lside == 0) && (lVar6 = lsame_(side,"R"), lVar6 == 0)) {
    strsm_::info = 1;
  }
  else if ((strsm_::upper == 0) && (lVar6 = lsame_(uplo,"L"), lVar6 == 0)) {
    strsm_::info = 2;
  }
  else {
    lVar6 = lsame_(transa,"N");
    if ((lVar6 == 0) &&
       ((lVar6 = lsame_(transa,"T"), lVar6 == 0 && (lVar6 = lsame_(transa,"C"), lVar6 == 0)))) {
      strsm_::info = 3;
    }
    else {
      lVar6 = lsame_(diag,"U");
      if ((lVar6 == 0) && (lVar6 = lsame_(diag,"N"), lVar6 == 0)) {
        strsm_::info = 4;
      }
      else if (*m < 0) {
        strsm_::info = 5;
      }
      else if (*n < 0) {
        strsm_::info = 6;
      }
      else {
        if (strsm_::nrowa < 2) {
          local_64 = 1;
        }
        else {
          local_64 = strsm_::nrowa;
        }
        if (*lda < local_64) {
          strsm_::info = 9;
        }
        else {
          if (*m < 2) {
            local_6c = 1;
          }
          else {
            local_6c = *m;
          }
          if (*ldb < local_6c) {
            strsm_::info = 0xb;
          }
        }
      }
    }
  }
  if (strsm_::info == 0) {
    if (*n != 0) {
      if ((*alpha != 0.0) || (NAN(*alpha))) {
        if (strsm_::lside == 0) {
          lVar6 = lsame_(transa,"N");
          if (lVar6 == 0) {
            if (strsm_::upper == 0) {
              iVar8 = *n;
              for (strsm_::k = 1; strsm_::k <= iVar8; strsm_::k = strsm_::k + 1) {
                if (strsm_::nounit != 0) {
                  strsm_::temp = 1.0 / a[(long)(strsm_::k + strsm_::k * iVar1) - (long)iVar4];
                  iVar7 = *m;
                  for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                    b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5] =
                         strsm_::temp * b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5];
                  }
                }
                iVar7 = *n;
                strsm_::j = strsm_::k;
                while (strsm_::j = strsm_::j + 1, strsm_::j <= iVar7) {
                  if ((a[(long)(strsm_::j + strsm_::k * iVar1) - (long)iVar4] != 0.0) ||
                     (NAN(a[(long)(strsm_::j + strsm_::k * iVar1) - (long)iVar4]))) {
                    strsm_::temp = a[(long)(strsm_::j + strsm_::k * iVar1) - (long)iVar4];
                    iVar3 = *m;
                    for (strsm_::i__ = 1; strsm_::i__ <= iVar3; strsm_::i__ = strsm_::i__ + 1) {
                      lVar9 = (long)(strsm_::i__ + strsm_::j * iVar2);
                      b[lVar9 - iVar5] =
                           -strsm_::temp * b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5]
                           + b[lVar9 - iVar5];
                    }
                  }
                }
                if ((*alpha != 1.0) || (NAN(*alpha))) {
                  iVar7 = *m;
                  for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                    b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5] =
                         *alpha * b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5];
                  }
                }
              }
            }
            else {
              for (strsm_::k = *n; 0 < strsm_::k; strsm_::k = strsm_::k + -1) {
                if (strsm_::nounit != 0) {
                  strsm_::temp = 1.0 / a[(long)(strsm_::k + strsm_::k * iVar1) - (long)iVar4];
                  iVar8 = *m;
                  for (strsm_::i__ = 1; strsm_::i__ <= iVar8; strsm_::i__ = strsm_::i__ + 1) {
                    b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5] =
                         strsm_::temp * b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5];
                  }
                }
                iVar8 = strsm_::k + -1;
                for (strsm_::j = 1; strsm_::j <= iVar8; strsm_::j = strsm_::j + 1) {
                  if ((a[(long)(strsm_::j + strsm_::k * iVar1) - (long)iVar4] != 0.0) ||
                     (NAN(a[(long)(strsm_::j + strsm_::k * iVar1) - (long)iVar4]))) {
                    strsm_::temp = a[(long)(strsm_::j + strsm_::k * iVar1) - (long)iVar4];
                    iVar7 = *m;
                    for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                      lVar9 = (long)(strsm_::i__ + strsm_::j * iVar2);
                      b[lVar9 - iVar5] =
                           -strsm_::temp * b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5]
                           + b[lVar9 - iVar5];
                    }
                  }
                }
                if ((*alpha != 1.0) || (NAN(*alpha))) {
                  iVar8 = *m;
                  for (strsm_::i__ = 1; strsm_::i__ <= iVar8; strsm_::i__ = strsm_::i__ + 1) {
                    b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5] =
                         *alpha * b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5];
                  }
                }
              }
            }
          }
          else if (strsm_::upper == 0) {
            for (strsm_::j = *n; 0 < strsm_::j; strsm_::j = strsm_::j + -1) {
              if ((*alpha != 1.0) || (NAN(*alpha))) {
                iVar8 = *m;
                for (strsm_::i__ = 1; strsm_::i__ <= iVar8; strsm_::i__ = strsm_::i__ + 1) {
                  b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] =
                       *alpha * b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5];
                }
              }
              iVar8 = *n;
              strsm_::k = strsm_::j;
              while (strsm_::k = strsm_::k + 1, strsm_::k <= iVar8) {
                if ((a[(long)(strsm_::k + strsm_::j * iVar1) - (long)iVar4] != 0.0) ||
                   (NAN(a[(long)(strsm_::k + strsm_::j * iVar1) - (long)iVar4]))) {
                  iVar7 = *m;
                  for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                    lVar9 = (long)(strsm_::i__ + strsm_::j * iVar2);
                    b[lVar9 - iVar5] =
                         -a[(long)(strsm_::k + strsm_::j * iVar1) - (long)iVar4] *
                         b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5] + b[lVar9 - iVar5]
                    ;
                  }
                }
              }
              if (strsm_::nounit != 0) {
                strsm_::temp = 1.0 / a[(long)(strsm_::j + strsm_::j * iVar1) - (long)iVar4];
                iVar8 = *m;
                for (strsm_::i__ = 1; strsm_::i__ <= iVar8; strsm_::i__ = strsm_::i__ + 1) {
                  b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] =
                       strsm_::temp * b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5];
                }
              }
            }
          }
          else {
            iVar8 = *n;
            for (strsm_::j = 1; strsm_::j <= iVar8; strsm_::j = strsm_::j + 1) {
              if ((*alpha != 1.0) || (NAN(*alpha))) {
                iVar7 = *m;
                for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                  b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] =
                       *alpha * b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5];
                }
              }
              iVar7 = strsm_::j + -1;
              for (strsm_::k = 1; strsm_::k <= iVar7; strsm_::k = strsm_::k + 1) {
                if ((a[(long)(strsm_::k + strsm_::j * iVar1) - (long)iVar4] != 0.0) ||
                   (NAN(a[(long)(strsm_::k + strsm_::j * iVar1) - (long)iVar4]))) {
                  iVar3 = *m;
                  for (strsm_::i__ = 1; strsm_::i__ <= iVar3; strsm_::i__ = strsm_::i__ + 1) {
                    lVar9 = (long)(strsm_::i__ + strsm_::j * iVar2);
                    b[lVar9 - iVar5] =
                         -a[(long)(strsm_::k + strsm_::j * iVar1) - (long)iVar4] *
                         b[(long)(strsm_::i__ + strsm_::k * iVar2) - (long)iVar5] + b[lVar9 - iVar5]
                    ;
                  }
                }
              }
              if (strsm_::nounit != 0) {
                strsm_::temp = 1.0 / a[(long)(strsm_::j + strsm_::j * iVar1) - (long)iVar4];
                iVar7 = *m;
                for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                  b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] =
                       strsm_::temp * b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5];
                }
              }
            }
          }
        }
        else {
          lVar6 = lsame_(transa,"N");
          if (lVar6 == 0) {
            if (strsm_::upper == 0) {
              iVar8 = *n;
              for (strsm_::j = 1; strsm_::j <= iVar8; strsm_::j = strsm_::j + 1) {
                for (strsm_::i__ = *m; 0 < strsm_::i__; strsm_::i__ = strsm_::i__ + -1) {
                  strsm_::temp = *alpha * b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5];
                  strsm_::k = strsm_::i__;
                  while (strsm_::k = strsm_::k + 1, strsm_::k <= *m) {
                    strsm_::temp = -a[(long)(strsm_::k + strsm_::i__ * iVar1) - (long)iVar4] *
                                   b[(long)(strsm_::k + strsm_::j * iVar2) - (long)iVar5] +
                                   strsm_::temp;
                  }
                  if (strsm_::nounit != 0) {
                    strsm_::temp = strsm_::temp /
                                   a[(long)(strsm_::i__ + strsm_::i__ * iVar1) - (long)iVar4];
                  }
                  b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] = strsm_::temp;
                }
              }
            }
            else {
              iVar8 = *n;
              for (strsm_::j = 1; strsm_::j <= iVar8; strsm_::j = strsm_::j + 1) {
                iVar7 = *m;
                for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                  strsm_::temp = *alpha * b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5];
                  for (strsm_::k = 1; strsm_::k <= strsm_::i__ + -1; strsm_::k = strsm_::k + 1) {
                    strsm_::temp = -a[(long)(strsm_::k + strsm_::i__ * iVar1) - (long)iVar4] *
                                   b[(long)(strsm_::k + strsm_::j * iVar2) - (long)iVar5] +
                                   strsm_::temp;
                  }
                  if (strsm_::nounit != 0) {
                    strsm_::temp = strsm_::temp /
                                   a[(long)(strsm_::i__ + strsm_::i__ * iVar1) - (long)iVar4];
                  }
                  b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] = strsm_::temp;
                }
              }
            }
          }
          else if (strsm_::upper == 0) {
            iVar8 = *n;
            for (strsm_::j = 1; strsm_::j <= iVar8; strsm_::j = strsm_::j + 1) {
              if ((*alpha != 1.0) || (NAN(*alpha))) {
                iVar7 = *m;
                for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                  b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] =
                       *alpha * b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5];
                }
              }
              iVar7 = *m;
              for (strsm_::k = 1; strsm_::k <= iVar7; strsm_::k = strsm_::k + 1) {
                if ((b[(long)(strsm_::k + strsm_::j * iVar2) - (long)iVar5] != 0.0) ||
                   (NAN(b[(long)(strsm_::k + strsm_::j * iVar2) - (long)iVar5]))) {
                  if (strsm_::nounit != 0) {
                    lVar9 = (long)(strsm_::k + strsm_::j * iVar2);
                    b[lVar9 - iVar5] =
                         b[lVar9 - iVar5] / a[(long)(strsm_::k + strsm_::k * iVar1) - (long)iVar4];
                  }
                  iVar3 = *m;
                  strsm_::i__ = strsm_::k;
                  while (strsm_::i__ = strsm_::i__ + 1, strsm_::i__ <= iVar3) {
                    lVar9 = (long)(strsm_::i__ + strsm_::j * iVar2);
                    b[lVar9 - iVar5] =
                         -b[(long)(strsm_::k + strsm_::j * iVar2) - (long)iVar5] *
                         a[(long)(strsm_::i__ + strsm_::k * iVar1) - (long)iVar4] + b[lVar9 - iVar5]
                    ;
                  }
                }
              }
            }
          }
          else {
            iVar8 = *n;
            for (strsm_::j = 1; strsm_::j <= iVar8; strsm_::j = strsm_::j + 1) {
              if ((*alpha != 1.0) || (NAN(*alpha))) {
                iVar7 = *m;
                for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                  b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] =
                       *alpha * b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5];
                }
              }
              for (strsm_::k = *m; 0 < strsm_::k; strsm_::k = strsm_::k + -1) {
                if ((b[(long)(strsm_::k + strsm_::j * iVar2) - (long)iVar5] != 0.0) ||
                   (NAN(b[(long)(strsm_::k + strsm_::j * iVar2) - (long)iVar5]))) {
                  if (strsm_::nounit != 0) {
                    lVar9 = (long)(strsm_::k + strsm_::j * iVar2);
                    b[lVar9 - iVar5] =
                         b[lVar9 - iVar5] / a[(long)(strsm_::k + strsm_::k * iVar1) - (long)iVar4];
                  }
                  iVar7 = strsm_::k + -1;
                  for (strsm_::i__ = 1; strsm_::i__ <= iVar7; strsm_::i__ = strsm_::i__ + 1) {
                    lVar9 = (long)(strsm_::i__ + strsm_::j * iVar2);
                    b[lVar9 - iVar5] =
                         -b[(long)(strsm_::k + strsm_::j * iVar2) - (long)iVar5] *
                         a[(long)(strsm_::i__ + strsm_::k * iVar1) - (long)iVar4] + b[lVar9 - iVar5]
                    ;
                  }
                }
              }
            }
          }
        }
      }
      else {
        iVar1 = *n;
        for (strsm_::j = 1; strsm_::j <= iVar1; strsm_::j = strsm_::j + 1) {
          iVar4 = *m;
          for (strsm_::i__ = 1; strsm_::i__ <= iVar4; strsm_::i__ = strsm_::i__ + 1) {
            b[(long)(strsm_::i__ + strsm_::j * iVar2) - (long)iVar5] = 0.0;
          }
        }
      }
    }
  }
  else {
    xerbla_("STRSM ",&strsm_::info);
  }
  return 0;
}

Assistant:

int strsm_(char *side, char *uplo, char *transa, char *diag,
	integer *m, integer *n, real *alpha, real *a, integer *lda, real *b,
	integer *ldb)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, j, k, info;
    static real temp;
    static logical lside;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);
    static logical nounit;


/*
    Purpose
    =======

    STRSM  solves one of the matrix equations

       op( A )*X = alpha*B,   or   X*op( A ) = alpha*B,

    where alpha is a scalar, X and B are m by n matrices, A is a unit, or
    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of

       op( A ) = A   or   op( A ) = A'.

    The matrix X is overwritten on B.

    Parameters
    ==========

    SIDE   - CHARACTER*1.
             On entry, SIDE specifies whether op( A ) appears on the left
             or right of X as follows:

                SIDE = 'L' or 'l'   op( A )*X = alpha*B.

                SIDE = 'R' or 'r'   X*op( A ) = alpha*B.

             Unchanged on exit.

    UPLO   - CHARACTER*1.
             On entry, UPLO specifies whether the matrix A is an upper or
             lower triangular matrix as follows:

                UPLO = 'U' or 'u'   A is an upper triangular matrix.

                UPLO = 'L' or 'l'   A is a lower triangular matrix.

             Unchanged on exit.

    TRANSA - CHARACTER*1.
             On entry, TRANSA specifies the form of op( A ) to be used in
             the matrix multiplication as follows:

                TRANSA = 'N' or 'n'   op( A ) = A.

                TRANSA = 'T' or 't'   op( A ) = A'.

                TRANSA = 'C' or 'c'   op( A ) = A'.

             Unchanged on exit.

    DIAG   - CHARACTER*1.
             On entry, DIAG specifies whether or not A is unit triangular
             as follows:

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.

                DIAG = 'N' or 'n'   A is not assumed to be unit
                                    triangular.

             Unchanged on exit.

    M      - INTEGER.
             On entry, M specifies the number of rows of B. M must be at
             least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of B.  N must be
             at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry,  ALPHA specifies the scalar  alpha. When  alpha is
             zero then  A is not referenced and  B need not be set before
             entry.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, k ), where k is m
             when  SIDE = 'L' or 'l'  and is  n  when  SIDE = 'R' or 'r'.
             Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
             upper triangular part of the array  A must contain the upper
             triangular matrix  and the strictly lower triangular part of
             A is not referenced.
             Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
             lower triangular part of the array  A must contain the lower
             triangular matrix  and the strictly upper triangular part of
             A is not referenced.
             Note that when  DIAG = 'U' or 'u',  the diagonal elements of
             A  are not referenced either,  but are assumed to be  unity.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
             LDA  must be at least  max( 1, m ),  when  SIDE = 'R' or 'r'
             then LDA must be at least max( 1, n ).
             Unchanged on exit.

    B      - REAL             array of DIMENSION ( LDB, n ).
             Before entry,  the leading  m by n part of the array  B must
             contain  the  right-hand  side  matrix  B,  and  on exit  is
             overwritten by the solution matrix  X.

    LDB    - INTEGER.
             On entry, LDB specifies the first dimension of B as declared
             in  the  calling  (sub)  program.   LDB  must  be  at  least
             max( 1, m ).
             Unchanged on exit.


    Level 3 Blas routine.


    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;

    /* Function Body */
    lside = lsame_(side, "L");
    if (lside) {
	nrowa = *m;
    } else {
	nrowa = *n;
    }
    nounit = lsame_(diag, "N");
    upper = lsame_(uplo, "U");

    info = 0;
    if (! lside && ! lsame_(side, "R")) {
	info = 1;
    } else if (! upper && ! lsame_(uplo, "L")) {
	info = 2;
    } else if (! lsame_(transa, "N") && ! lsame_(transa,
	     "T") && ! lsame_(transa, "C")) {
	info = 3;
    } else if (! lsame_(diag, "U") && ! lsame_(diag,
	    "N")) {
	info = 4;
    } else if (*m < 0) {
	info = 5;
    } else if (*n < 0) {
	info = 6;
    } else if (*lda < max(1,nrowa)) {
	info = 9;
    } else if (*ldb < max(1,*m)) {
	info = 11;
    }
    if (info != 0) {
	xerbla_("STRSM ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    i__2 = *m;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		b[i__ + j * b_dim1] = 0.f;
/* L10: */
	    }
/* L20: */
	}
	return 0;
    }

/*     Start the operations. */

    if (lside) {
	if (lsame_(transa, "N")) {

/*           Form  B := alpha*inv( A )*B. */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L30: */
			}
		    }
		    for (k = *m; k >= 1; --k) {
			if (b[k + j * b_dim1] != 0.f) {
			    if (nounit) {
				b[k + j * b_dim1] /= a[k + k * a_dim1];
			    }
			    i__2 = k - 1;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= b[k + j * b_dim1] * a[
					i__ + k * a_dim1];
/* L40: */
			    }
			}
/* L50: */
		    }
/* L60: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L70: */
			}
		    }
		    i__2 = *m;
		    for (k = 1; k <= i__2; ++k) {
			if (b[k + j * b_dim1] != 0.f) {
			    if (nounit) {
				b[k + j * b_dim1] /= a[k + k * a_dim1];
			    }
			    i__3 = *m;
			    for (i__ = k + 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= b[k + j * b_dim1] * a[
					i__ + k * a_dim1];
/* L80: */
			    }
			}
/* L90: */
		    }
/* L100: */
		}
	    }
	} else {

/*           Form  B := alpha*inv( A' )*B. */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *m;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			temp = *alpha * b[i__ + j * b_dim1];
			i__3 = i__ - 1;
			for (k = 1; k <= i__3; ++k) {
			    temp -= a[k + i__ * a_dim1] * b[k + j * b_dim1];
/* L110: */
			}
			if (nounit) {
			    temp /= a[i__ + i__ * a_dim1];
			}
			b[i__ + j * b_dim1] = temp;
/* L120: */
		    }
/* L130: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    for (i__ = *m; i__ >= 1; --i__) {
			temp = *alpha * b[i__ + j * b_dim1];
			i__2 = *m;
			for (k = i__ + 1; k <= i__2; ++k) {
			    temp -= a[k + i__ * a_dim1] * b[k + j * b_dim1];
/* L140: */
			}
			if (nounit) {
			    temp /= a[i__ + i__ * a_dim1];
			}
			b[i__ + j * b_dim1] = temp;
/* L150: */
		    }
/* L160: */
		}
	    }
	}
    } else {
	if (lsame_(transa, "N")) {

/*           Form  B := alpha*B*inv( A ). */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L170: */
			}
		    }
		    i__2 = j - 1;
		    for (k = 1; k <= i__2; ++k) {
			if (a[k + j * a_dim1] != 0.f) {
			    i__3 = *m;
			    for (i__ = 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= a[k + j * a_dim1] * b[
					i__ + k * b_dim1];
/* L180: */
			    }
			}
/* L190: */
		    }
		    if (nounit) {
			temp = 1.f / a[j + j * a_dim1];
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = temp * b[i__ + j * b_dim1];
/* L200: */
			}
		    }
/* L210: */
		}
	    } else {
		for (j = *n; j >= 1; --j) {
		    if (*alpha != 1.f) {
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L220: */
			}
		    }
		    i__1 = *n;
		    for (k = j + 1; k <= i__1; ++k) {
			if (a[k + j * a_dim1] != 0.f) {
			    i__2 = *m;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= a[k + j * a_dim1] * b[
					i__ + k * b_dim1];
/* L230: */
			    }
			}
/* L240: */
		    }
		    if (nounit) {
			temp = 1.f / a[j + j * a_dim1];
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + j * b_dim1] = temp * b[i__ + j * b_dim1];
/* L250: */
			}
		    }
/* L260: */
		}
	    }
	} else {

/*           Form  B := alpha*B*inv( A' ). */

	    if (upper) {
		for (k = *n; k >= 1; --k) {
		    if (nounit) {
			temp = 1.f / a[k + k * a_dim1];
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + k * b_dim1] = temp * b[i__ + k * b_dim1];
/* L270: */
			}
		    }
		    i__1 = k - 1;
		    for (j = 1; j <= i__1; ++j) {
			if (a[j + k * a_dim1] != 0.f) {
			    temp = a[j + k * a_dim1];
			    i__2 = *m;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= temp * b[i__ + k *
					b_dim1];
/* L280: */
			    }
			}
/* L290: */
		    }
		    if (*alpha != 1.f) {
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + k * b_dim1] = *alpha * b[i__ + k * b_dim1]
				    ;
/* L300: */
			}
		    }
/* L310: */
		}
	    } else {
		i__1 = *n;
		for (k = 1; k <= i__1; ++k) {
		    if (nounit) {
			temp = 1.f / a[k + k * a_dim1];
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + k * b_dim1] = temp * b[i__ + k * b_dim1];
/* L320: */
			}
		    }
		    i__2 = *n;
		    for (j = k + 1; j <= i__2; ++j) {
			if (a[j + k * a_dim1] != 0.f) {
			    temp = a[j + k * a_dim1];
			    i__3 = *m;
			    for (i__ = 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= temp * b[i__ + k *
					b_dim1];
/* L330: */
			    }
			}
/* L340: */
		    }
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + k * b_dim1] = *alpha * b[i__ + k * b_dim1]
				    ;
/* L350: */
			}
		    }
/* L360: */
		}
	    }
	}
    }

    return 0;

/*     End of STRSM . */

}